

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_string_vector(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_attr_chlist_entry_t *peVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  exr_attr_chlist_t *peVar5;
  long lVar6;
  int32_t isz;
  undefined8 local_38;
  
  lVar4 = (long)((a->field_6).chlist)->num_channels;
  if (lVar4 < 1) {
    uVar3 = 0;
  }
  else {
    lVar6 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (long)*(int *)(((a->field_6).chlist)->entries->reserved + lVar6 + -0x15) + 4;
      lVar6 = lVar6 + 0x10;
    } while (lVar4 * 0x10 != lVar6);
  }
  if (uVar3 >> 0x1f == 0) {
    local_38 = CONCAT44((int)uVar3,(int)in_RAX);
    iVar2 = (*ctxt->do_write)(ctxt,(void *)((long)&local_38 + 4),4,&ctxt->output_file_offset);
  }
  else {
    local_38 = in_RAX;
    iVar2 = (*ctxt->standard_error)(ctxt,3);
  }
  if ((iVar2 == 0) && (peVar5 = (a->field_6).chlist, 0 < peVar5->num_channels)) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      peVar1 = peVar5->entries;
      if (*(int *)(peVar1->reserved + lVar6 + -0x15) < 0) {
        iVar2 = (*ctxt->standard_error)(ctxt,3);
      }
      else {
        local_38 = CONCAT44(local_38._4_4_,*(int *)(peVar1->reserved + lVar6 + -0x15));
        iVar2 = (*ctxt->do_write)(ctxt,&local_38,4,&ctxt->output_file_offset);
      }
      if (iVar2 == 0) {
        iVar2 = (*ctxt->do_write)(ctxt,*(void **)(peVar1->reserved + lVar6 + -0xd),
                                  (long)*(int *)(peVar1->reserved + lVar6 + -0x15),
                                  &ctxt->output_file_offset);
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar4 = lVar4 + 1;
      peVar5 = (a->field_6).chlist;
      lVar6 = lVar6 + 0x10;
      iVar2 = 0;
    } while (lVar4 < peVar5->num_channels);
  }
  return iVar2;
}

Assistant:

static exr_result_t
save_string_vector (
    struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    size_t       attrsz = 0;

    for (int i = 0; i < a->stringvector->n_strings; ++i)
    {
        attrsz += sizeof (int32_t);
        attrsz += (size_t) a->stringvector->strings[i].length;
    }

    rv = save_attr_sz (ctxt, attrsz);

    for (int i = 0; rv == EXR_ERR_SUCCESS && i < a->stringvector->n_strings;
         ++i)
    {
        const exr_attr_string_t* s = a->stringvector->strings + i;

        rv = save_attr_sz (ctxt, (size_t) s->length);
        if (rv == EXR_ERR_SUCCESS)
            rv = ctxt->do_write (
                ctxt,
                s->str,
                (uint64_t) s->length,
                &(ctxt->output_file_offset));
    }

    return rv;
}